

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

int __thiscall
TPZSkylMatrix<std::complex<long_double>_>::Decompose_Cholesky
          (TPZSkylMatrix<std::complex<long_double>_> *this,
          list<long,_std::allocator<long>_> *singular)

{
  size_t *psVar1;
  unkbyte10 Var2;
  char cVar3;
  complex<long_double> **ppcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  list<long,_std::allocator<long>_> *plVar9;
  int iVar10;
  int extraout_var;
  _List_node_base *p_Var11;
  ostream *poVar12;
  long lVar13;
  ulong uVar14;
  _List_node_base *p_Var15;
  long lVar16;
  complex<long_double> *pcVar17;
  _List_node_base *p_Var18;
  long lVar19;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  complex<long_double> *pcVar23;
  long lVar24;
  complex<long_double> *pcVar25;
  longdouble in_ST0;
  longdouble lVar26;
  longdouble lVar27;
  longdouble in_ST1;
  longdouble lVar28;
  longdouble in_ST2;
  longdouble lVar29;
  longdouble lVar30;
  longdouble in_ST3;
  longdouble in_ST4;
  complex<long_double> __r;
  undefined4 uVar31;
  undefined2 uVar32;
  undefined4 uVar33;
  undefined2 uVar34;
  complex<long_double> local_148;
  _List_node_base *local_120;
  longdouble local_114;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined2 uStack_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  undefined8 local_f8;
  undefined2 uStack_f0;
  undefined4 uStack_ee;
  undefined2 uStack_ea;
  list<long,_std::allocator<long>_> *local_e8;
  TPZSkylMatrix<std::complex<long_double>_> *local_e0;
  longdouble local_d4;
  _List_node_base *local_c8;
  _List_node_base *local_c0;
  _List_node_base *local_b8;
  complex<long_double> *local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  undefined1 local_88 [36];
  longdouble local_64;
  undefined1 local_58 [40];
  
  cVar3 = (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDecomposed;
  local_e8 = singular;
  if (cVar3 != '\0') {
    if (cVar3 == '\x03') {
      return 1;
    }
    TPZMatrix<std::complex<long_double>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<long double>>::Decompose_Cholesky(std::list<int64_t> &) [TVar = std::complex<long double>]"
               ,"Decompose_Cholesky <Matrix already Decomposed>");
  }
  std::__cxx11::list<long,_std::allocator<long>_>::clear(local_e8);
  lVar28 = (longdouble)0;
  local_108 = SUB104(lVar28,0);
  uStack_104 = (undefined4)((unkuint10)lVar28 >> 0x20);
  uStack_100 = (undefined2)((unkuint10)lVar28 >> 0x40);
  local_f8 = SUB108(lVar28,0);
  uStack_f0 = uStack_100;
  iVar10 = (*(this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
             super_TPZSavable._vptr_TPZSavable[0xc])(this);
  p_Var15 = (_List_node_base *)CONCAT44(extraout_var,iVar10);
  if (p_Var15 != (_List_node_base *)0x0 && -1 < extraout_var) {
    local_64 = (longdouble)1e-16;
    local_120 = (_List_node_base *)0x0;
    local_e0 = this;
    local_c0 = p_Var15;
    do {
      ppcVar4 = (this->fElem).fStore;
      pcVar23 = ppcVar4[(long)local_120];
      pcVar25 = ppcVar4[(long)((long)&local_120->_M_next + 1)];
      if (pcVar25 == pcVar23) {
        return 0;
      }
      if ((long)pcVar25 - (long)pcVar23 < 0x21) {
        lVar28 = (longdouble)0;
        lVar29 = lVar28;
        lVar26 = in_ST1;
        lVar30 = in_ST2;
        in_ST1 = in_ST4;
      }
      else {
        pcVar23 = pcVar23 + 1;
        lVar28 = (longdouble)0;
        lVar29 = lVar28;
        do {
          Var2 = *(unkbyte10 *)pcVar23->_M_value;
          lVar26 = -*(longdouble *)(pcVar23->_M_value + 0x10);
          local_148._M_value._0_4_ = SUB104(Var2,0);
          local_148._M_value._4_2_ = SUB102((unkuint10)Var2 >> 0x20,0);
          local_148._M_value._6_2_ = SUB102((unkuint10)Var2 >> 0x30,0);
          local_148._M_value._8_2_ = SUB102((unkuint10)Var2 >> 0x40,0);
          local_148._M_value._16_4_ = SUB104(lVar26,0);
          local_148._M_value._20_4_ = SUB104((unkuint10)lVar26 >> 0x20,0);
          local_148._M_value._24_2_ = SUB102((unkuint10)lVar26 >> 0x40,0);
          local_114 = lVar28;
          local_d4 = lVar29;
          std::complex<long_double>::operator*=(&local_148,pcVar23);
          lVar29 = (longdouble)
                   CONCAT28(local_148._M_value._8_2_,
                            CONCAT26(local_148._M_value._6_2_,
                                     CONCAT24(local_148._M_value._4_2_,local_148._M_value._0_4_))) +
                   local_d4;
          lVar28 = (longdouble)
                   CONCAT28(local_148._M_value._24_2_,
                            CONCAT44(local_148._M_value._20_4_,local_148._M_value._16_4_)) +
                   local_114;
          pcVar23 = pcVar23 + 1;
        } while (pcVar23 < pcVar25);
        pcVar23 = (this->fElem).fStore[(long)local_120];
        lVar26 = in_ST1;
        lVar30 = in_ST2;
        in_ST1 = in_ST4;
      }
      lVar29 = *(longdouble *)pcVar23->_M_value - lVar29;
      lVar28 = *(longdouble *)(pcVar23->_M_value + 0x10) - lVar28;
      local_108 = SUB104(lVar29,0);
      uStack_104 = (undefined4)((unkuint10)lVar29 >> 0x20);
      uStack_100 = (undefined2)((unkuint10)lVar29 >> 0x40);
      uStack_fa = *(undefined2 *)(pcVar23->_M_value + 0xe);
      uStack_fe = (undefined2)*(undefined4 *)(pcVar23->_M_value + 10);
      uStack_fc = (undefined2)((uint)*(undefined4 *)(pcVar23->_M_value + 10) >> 0x10);
      local_f8 = SUB108(lVar28,0);
      uStack_f0 = (undefined2)((unkuint10)lVar28 >> 0x40);
      uStack_ee = *(undefined4 *)(pcVar23->_M_value + 0x1a);
      uStack_ea = *(undefined2 *)(pcVar23->_M_value + 0x1e);
      local_148._M_value._4_2_ = SUB102((unkuint10)lVar29 >> 0x20,0);
      local_148._M_value._6_2_ = SUB102((unkuint10)lVar29 >> 0x30,0);
      local_148._M_value._16_4_ = SUB104(lVar28,0);
      local_148._M_value._20_4_ = SUB104((unkuint10)lVar28 >> 0x20,0);
      in_ST2 = in_ST1;
      lVar28 = in_ST1;
      local_148._M_value._0_4_ = local_108;
      local_148._M_value._8_2_ = uStack_100;
      local_148._M_value._24_2_ = uStack_f0;
      cabsl();
      local_b0 = pcVar25;
      if (local_64 <= in_ST0) {
        lVar29 = (longdouble)CONCAT28(uStack_100,CONCAT44(uStack_104,local_108));
        lVar27 = (longdouble)CONCAT28(uStack_f0,local_f8);
        in_ST0 = in_ST3;
        in_ST3 = lVar28;
      }
      else {
        p_Var11 = (_List_node_base *)operator_new(0x18);
        plVar9 = local_e8;
        p_Var11[1]._M_next = local_120;
        std::__detail::_List_node_base::_M_hook(p_Var11);
        psVar1 = &(plVar9->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Decompose_Cholesky",0x12);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," Singular equation pivot ",0x19);
        poVar12 = std::operator<<((ostream *)&std::cout,(complex *)&local_108);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," k ",3);
        poVar12 = std::ostream::_M_insert<long>((long)poVar12);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        lVar29 = (longdouble)1;
        local_108 = SUB104(lVar29,0);
        uStack_104 = (undefined4)((unkuint10)lVar29 >> 0x20);
        uStack_100 = (undefined2)((unkuint10)lVar29 >> 0x40);
        lVar27 = (longdouble)0;
        local_f8 = SUB108(lVar27,0);
        uStack_f0 = (undefined2)((unkuint10)lVar27 >> 0x40);
        in_ST0 = in_ST3;
        in_ST3 = in_ST2;
      }
      local_148._M_value._0_4_ = SUB104(lVar29,0);
      local_148._M_value._4_2_ = SUB102((unkuint10)lVar29 >> 0x20,0);
      local_148._M_value._6_2_ = SUB102((unkuint10)lVar29 >> 0x30,0);
      local_148._M_value._8_2_ = SUB102((unkuint10)lVar29 >> 0x40,0);
      local_148._M_value._16_4_ = SUB104(lVar27,0);
      local_148._M_value._20_4_ = SUB104((unkuint10)lVar27 >> 0x20,0);
      local_148._M_value._24_2_ = SUB102((unkuint10)lVar27 >> 0x40,0);
      in_ST4 = in_ST3;
      csqrtl();
      pcVar25 = (this->fElem).fStore[(long)local_120];
      *(longdouble *)pcVar25->_M_value = lVar26;
      *(longdouble *)(pcVar25->_M_value + 0x10) = lVar30;
      local_f8 = *(undefined8 *)(pcVar25->_M_value + 0x10);
      uVar5 = *(undefined8 *)(pcVar25->_M_value + 0x18);
      uStack_f0 = (undefined2)uVar5;
      uStack_ee = (undefined4)((ulong)uVar5 >> 0x10);
      uStack_ea = (undefined2)((ulong)uVar5 >> 0x30);
      local_108 = *(undefined4 *)pcVar25->_M_value;
      uStack_104 = *(undefined4 *)(pcVar25->_M_value + 4);
      uStack_100 = (undefined2)*(undefined4 *)(pcVar25->_M_value + 8);
      uStack_fe = (undefined2)((uint)*(undefined4 *)(pcVar25->_M_value + 8) >> 0x10);
      uStack_fc = (undefined2)*(undefined4 *)(pcVar25->_M_value + 0xc);
      uStack_fa = (undefined2)((uint)*(undefined4 *)(pcVar25->_M_value + 0xc) >> 0x10);
      p_Var11 = (_List_node_base *)((long)&local_120->_M_next + 1);
      local_c8 = p_Var11;
      if ((long)p_Var11 < (long)p_Var15) {
        lVar24 = 2;
        lVar16 = -0x40;
        lVar19 = 0x40;
        p_Var18 = local_120;
        lVar28 = in_ST0;
        lVar29 = in_ST1;
        do {
          ppcVar4 = (this->fElem).fStore;
          pcVar25 = ppcVar4[(long)p_Var11];
          lVar13 = (long)ppcVar4[(long)((long)&p_Var11->_M_next + 1)] - (long)pcVar25 >> 5;
          if (lVar24 < lVar13) {
            local_98 = lVar24 * 0x20;
            pcVar23 = ppcVar4[(long)local_120];
            pcVar17 = pcVar23 + 1;
            uVar22 = (ulong)((long)local_b0 - (long)pcVar17) >> 5;
            uVar20 = (uint)uVar22;
            uVar21 = (uint)((ulong)((long)ppcVar4[(long)((long)&p_Var18->_M_next + 2)] -
                                   (long)(pcVar25 + lVar24)) >> 5);
            if (uVar20 < uVar21) {
              uVar21 = uVar20;
            }
            in_ST0 = in_ST2;
            in_ST1 = in_ST3;
            local_b8 = p_Var11;
            local_90 = lVar19;
            if (uVar21 != 0) {
              uVar14 = (ulong)((long)ppcVar4[(long)((long)&p_Var18->_M_next + 2)] +
                              (lVar16 - (long)pcVar25)) >> 5;
              if ((uint)uVar14 < uVar20) {
                uVar22 = uVar14;
              }
              uVar22 = uVar22 & 0xffffffff;
              lVar13 = 0;
              lVar26 = (longdouble)0;
              lVar30 = lVar26;
              local_a8 = lVar16;
              local_a0 = lVar24;
              do {
                local_88._0_10_ = *(unkbyte10 *)(pcVar17->_M_value + lVar13);
                local_88._16_10_ = -*(longdouble *)(pcVar23[1]._M_value + lVar13 + 0x10);
                uVar5 = *(undefined8 *)(pcVar25->_M_value + lVar13 + lVar19);
                uVar6 = *(undefined8 *)((long)(pcVar25->_M_value + lVar13 + lVar19) + 8);
                uVar7 = *(undefined8 *)(pcVar25->_M_value + lVar13 + lVar19 + 0x10);
                uVar8 = *(undefined8 *)((long)(pcVar25->_M_value + lVar13 + lVar19 + 0x10) + 8);
                local_148._M_value._0_4_ = SUB84(uVar5,0);
                local_148._M_value._4_2_ = SUB82((ulong)uVar5 >> 0x20,0);
                local_148._M_value._6_2_ = SUB82((ulong)uVar5 >> 0x30,0);
                local_148._M_value._8_2_ = SUB82(uVar6,0);
                local_148._M_value._10_2_ = SUB82((ulong)uVar6 >> 0x10,0);
                local_148._M_value._12_4_ = SUB84((ulong)uVar6 >> 0x20,0);
                local_148._M_value._16_4_ = SUB84(uVar7,0);
                local_148._M_value._20_4_ = SUB84((ulong)uVar7 >> 0x20,0);
                local_148._M_value._24_2_ = SUB82(uVar8,0);
                local_148._M_value._26_2_ = SUB82((ulong)uVar8 >> 0x10,0);
                local_148._M_value._28_4_ = SUB84((ulong)uVar8 >> 0x20,0);
                local_114 = lVar26;
                local_d4 = lVar30;
                std::complex<long_double>::operator*=(&local_148,(complex<long_double> *)local_88);
                lVar30 = (longdouble)
                         CONCAT28(local_148._M_value._8_2_,
                                  CONCAT26(local_148._M_value._6_2_,
                                           CONCAT24(local_148._M_value._4_2_,
                                                    local_148._M_value._0_4_))) + local_d4;
                lVar26 = (longdouble)
                         CONCAT28(local_148._M_value._24_2_,
                                  CONCAT44(local_148._M_value._20_4_,local_148._M_value._16_4_)) +
                         local_114;
                lVar13 = lVar13 + 0x20;
                uVar21 = (int)uVar22 - 1;
                uVar22 = (ulong)uVar21;
              } while (uVar21 != 0);
              pcVar25 = (local_e0->fElem).fStore[(long)local_b8];
              lVar16 = local_a8;
              lVar24 = local_a0;
              in_ST0 = in_ST2;
              in_ST1 = in_ST3;
            }
            lVar19 = local_98;
            p_Var18 = local_b8;
            this = local_e0;
            local_148._M_value._4_2_ = *(undefined2 *)(pcVar25->_M_value + local_98 + -0x12);
            local_148._M_value._0_4_ = *(undefined4 *)(pcVar25->_M_value + local_98 + -0x16);
            local_88._4_2_ = *(undefined2 *)(pcVar25->_M_value + local_98 + -2);
            local_88._0_4_ = *(undefined4 *)(pcVar25->_M_value + local_98 + -6);
            in_ST2 = in_ST1;
            in_ST3 = in_ST1;
            in_ST4 = in_ST1;
            __divxc3();
            pcVar25 = (this->fElem).fStore[(long)p_Var18];
            *(longdouble *)(pcVar25[-1]._M_value + lVar19) = lVar28;
            *(undefined4 *)(pcVar25->_M_value + lVar19 + -0x16) = local_148._M_value._0_4_;
            *(undefined2 *)(pcVar25->_M_value + lVar19 + -0x12) = local_148._M_value._4_2_;
            *(longdouble *)(pcVar25->_M_value + lVar19 + -0x10) = lVar29;
            *(undefined2 *)(pcVar25->_M_value + lVar19 + -2) = local_88._4_2_;
            *(undefined4 *)(pcVar25->_M_value + lVar19 + -6) = local_88._0_4_;
            p_Var15 = local_c0;
            lVar19 = local_90;
          }
          else {
            p_Var18 = p_Var11;
            in_ST0 = lVar28;
            in_ST1 = lVar29;
            if (lVar13 == lVar24) {
              in_ST0 = in_ST2;
              in_ST1 = in_ST3;
              in_ST2 = in_ST3;
              in_ST4 = in_ST3;
              __divxc3();
              *(longdouble *)pcVar25[lVar24 + -1]._M_value = lVar28;
              *(longdouble *)(pcVar25[lVar24 + -1]._M_value + 0x10) = lVar29;
              p_Var15 = local_c0;
              this = local_e0;
            }
          }
          lVar24 = lVar24 + 1;
          p_Var11 = (_List_node_base *)((long)&p_Var18->_M_next + 1);
          lVar16 = lVar16 + -0x20;
          lVar19 = lVar19 + 0x20;
          lVar28 = in_ST0;
          lVar29 = in_ST1;
        } while ((long)p_Var11 < (long)p_Var15);
      }
      local_120 = local_c8;
    } while (local_c8 != p_Var15);
  }
  lVar16 = (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
  if (lVar16 != 0) {
    (*(this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x24])(local_58,this,lVar16 + -1);
    local_148._M_value._0_4_ = SUB104(local_58._0_10_,0);
    local_148._M_value._4_2_ = SUB102(local_58._0_10_,4);
    local_148._M_value._6_2_ = SUB102(local_58._0_10_,6);
    local_148._M_value._8_2_ = SUB102(local_58._0_10_,8);
    local_148._M_value._16_4_ = SUB104(local_58._16_10_,0);
    local_148._M_value._20_4_ = SUB104(local_58._16_10_,4);
    local_148._M_value._24_2_ = SUB102(local_58._16_10_,8);
    cabsl();
    local_114 = ABS(in_ST0);
    lVar28 = (longdouble)1e-15;
    local_148._M_value._0_4_ = SUB104(lVar28,0);
    local_148._M_value._4_2_ = SUB102((unkuint10)lVar28 >> 0x20,0);
    local_148._M_value._6_2_ = SUB102((unkuint10)lVar28 >> 0x30,0);
    local_148._M_value._8_2_ = SUB102((unkuint10)lVar28 >> 0x40,0);
    lVar28 = (longdouble)0;
    local_148._M_value._16_4_ = SUB104(lVar28,0);
    local_148._M_value._20_4_ = SUB104((unkuint10)lVar28 >> 0x20,0);
    local_148._M_value._24_2_ = SUB102((unkuint10)lVar28 >> 0x40,0);
    uVar31 = local_148._M_value._0_4_;
    uVar32 = local_148._M_value._8_2_;
    uVar33 = local_148._M_value._16_4_;
    uVar34 = local_148._M_value._24_2_;
    cabsl();
    if (local_114 < ABS(in_ST1)) {
      lVar16 = (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
      p_Var15 = (_List_node_base *)operator_new(0x18);
      plVar9 = local_e8;
      p_Var15[1]._M_next = (_List_node_base *)(lVar16 + -1);
      std::__detail::_List_node_base::_M_hook(p_Var15);
      psVar1 = &(plVar9->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      lVar16 = (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow + -1;
      lVar28 = (longdouble)1;
      local_148._M_value._0_4_ = SUB104(lVar28,0);
      local_148._M_value._4_2_ = SUB102((unkuint10)lVar28 >> 0x20,0);
      local_148._M_value._6_2_ = SUB102((unkuint10)lVar28 >> 0x30,0);
      local_148._M_value._8_2_ = SUB102((unkuint10)lVar28 >> 0x40,0);
      lVar28 = (longdouble)0;
      local_148._M_value._16_4_ = SUB104(lVar28,0);
      local_148._M_value._20_4_ = SUB104((unkuint10)lVar28 >> 0x20,0);
      local_148._M_value._24_2_ = SUB102((unkuint10)lVar28 >> 0x40,0);
      (*(this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x23])
                (this,lVar16,lVar16,&local_148,in_R8,in_R9,uVar31,uVar32,uVar33,uVar34);
    }
  }
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDecomposed = '\x03';
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDefPositive = '\x01';
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular)
{
	if(this->fDecomposed == ECholesky) return 1;
	if (  this->fDecomposed )  TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_Cholesky <Matrix already Decomposed>" );
    
#ifdef DUMP_BEFORE_DECOMPOSE
	dump_matrix(this, "TPZSkylMatrix::Decompose_Cholesky(singular)");
#endif
    
	singular.clear();
	TVar pivot;
	RTVar Tol;
	ZeroTolerance(Tol);
	int64_t dimension = this->Dim();
	/*  if(Dim() > 100) {
	 cout << "\nTPZSkylMatrix Cholesky decomposition Dim = " << Dim() << endl;
	 cout.flush();
	 }*/
	for ( int64_t k = 0; k < dimension; k++ )
	{
		/*    if(!(k%100) && Dim() > 100) {
		 cout <<  k << ' ';
		 cout.flush();
		 }
		 if(!(k%1000)) cout << endl;*/
		if ( Size(k) == 0 )	return( 0 );
		
		// Faz sum = SOMA( A(k,p) * A(k,p) ), p = 1, ..., k-1.
		//
		TVar sum = 0.0;
		TVar *elem_k = fElem[k]+1;
		TVar *end_k  = fElem[k]+Size(k);
        if constexpr (is_complex<TVar>::value){
            for ( ; elem_k < end_k; elem_k++ ) sum += std::conj(*elem_k) * (*elem_k);
        }else{
#pragma clang loop vectorize_width(2)
            for ( ; elem_k < end_k; elem_k++ ) sum += (*elem_k) * (*elem_k);
        }

		
		// Faz A(k,k) = sqrt( A(k,k) - sum ).
		//
		pivot = fElem[k][0] - sum;
        //		if ( pivot < ((TVar)1.e-9) ) {
		if(abs(pivot) < Tol) {
			singular.push_back(k);
            std::cout << __FUNCTION__ << " Singular equation pivot " << pivot << " k " << k << std::endl;
			pivot = 1.;
		}
		// A matriz nao e' definida positiva.
		
		pivot = fElem[k][0] = sqrt( pivot );
		
		// Loop para i = k+1 ... Dim().
		//
		int64_t i=k+1;
		for ( int64_t j = 2; i<dimension; j++,i++ ) {
			// Se tiverem elementos na linha 'i' cuja coluna e'
			//  menor do que 'K'...
			if ( Size(i) > j ) {
				// Faz sum = SOMA( A(i,p) * A(k,p) ), p = 1,..,k-1.
				sum = 0.0;
				TVar *elem_i = &fElem[i][j];
				TVar *end_i  = fElem[i+1];
				elem_k = &(fElem[k][1]);
				// Vectorizable loop
				unsigned max_l = end_i - elem_i;
				unsigned tmp = end_k - elem_k;
				if (tmp < max_l) max_l = tmp;
                if constexpr (is_complex<TVar>::value){
                    for(unsigned l=0; l<max_l; l++) 
                        sum += (*elem_i++) * std::conj(*elem_k++);
                }else{
#pragma clang loop vectorize_width(2)
                    for(unsigned l=0; l<max_l; l++) 
                        sum += (*elem_i++) * (*elem_k++);
                }

				// Faz A(i,k) = (A(i,k) - sum) / A(k,k)
				fElem[i][j-1] = (fElem[i][j-1] -sum) / pivot;
			} else if ( Size(i) == j ) fElem[i][j-1] /= pivot;
			
			// Se nao tiverem estes elementos, sum = 0.0.
			
			// Se nao existir nem o elemento A(i,k), nao faz nada.
		}
	}
	
	if(this->Rows() && fabs(GetVal(this->Rows()-1,this->Rows()-1)) < fabs((TVar)1.e-15))
	{
		singular.push_back(this->Rows()-1);
		PutVal(this->Rows()-1,this->Rows()-1,1.);
	}
	this->fDecomposed  = ECholesky;
	this->fDefPositive = 1;
	return( 1 );
}